

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
::try_emplace_impl<cs_impl::any_const&>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
          *this,any *k)

{
  long lVar1;
  proxy *ppVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 extraout_var;
  size_t i;
  size_t hashval;
  pair<unsigned_long,_bool> pVar6;
  ulong uVar5;
  
  if (k->mDat == (proxy *)0x0) {
    uVar5 = 0;
  }
  else {
    iVar4 = (*k->mDat->data->_vptr_baseHolder[7])();
    uVar5 = CONCAT44(extraout_var,iVar4);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  hashval = SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
            SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0);
  pVar6 = raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
          ::find_or_prepare_insert<cs_impl::any>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                      *)this,k,hashval);
  i = pVar6.first;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar1 = *(long *)(this + 8);
    ppVar2 = k->mDat;
    if (ppVar2 != (proxy *)0x0) {
      ppVar2->refcount = ppVar2->refcount + 1;
    }
    *(proxy **)(lVar1 + i * 0x10) = ppVar2;
    *(undefined8 *)(lVar1 + 8 + i * 0x10) = 0;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                *)this,i,(byte)hashval & 0x7f);
  }
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 0x10 + lVar1);
  __return_storage_ptr__->second = pVar6.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
			{
				size_t hashval = this->hash(k);
				auto res = this->find_or_prepare_insert(k, hashval);
				if (res.second) {
					this->emplace_at(res.first, std::piecewise_construct,
					                 std::forward_as_tuple(std::forward<K>(k)),
					                 std::forward_as_tuple(std::forward<Args>(args)...));
					this->set_ctrl(res.first, H2(hashval));
				}
				return {this->iterator_at(res.first), res.second};
			}